

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QMdiSubWindow_*>::end(QList<QMdiSubWindow_*> *this)

{
  QMdiSubWindow **n;
  QArrayDataPointer<QMdiSubWindow_*> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<QMdiSubWindow_*> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QMdiSubWindow_*> *)0x6269d9);
  QArrayDataPointer<QMdiSubWindow_*>::operator->(in_RDI);
  n = QArrayDataPointer<QMdiSubWindow_*>::end(in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }